

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

int __thiscall rapidjson::internal::BigInteger::Compare(BigInteger *this,BigInteger *rhs)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = this->count_;
  if (uVar3 == rhs->count_) {
    do {
      if (uVar3 == 0) {
        return 0;
      }
      lVar1 = uVar3 - 1;
      lVar2 = uVar3 - 1;
      uVar3 = uVar3 - 1;
    } while (this->digits_[lVar1] == rhs->digits_[lVar2]);
    bVar4 = this->digits_[lVar1] < rhs->digits_[lVar2];
  }
  else {
    bVar4 = uVar3 < rhs->count_;
  }
  return -(uint)bVar4 | 1;
}

Assistant:

int Compare(const BigInteger& rhs) const {
        if (count_ != rhs.count_)
            return count_ < rhs.count_ ? -1 : 1;

        for (size_t i = count_; i-- > 0;)
            if (digits_[i] != rhs.digits_[i])
                return digits_[i] < rhs.digits_[i] ? -1 : 1;

        return 0;
    }